

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_tls12_server.c
# Opt level: O0

int mbedtls_ssl_set_client_transport_id(mbedtls_ssl_context *ssl,uchar *info,size_t ilen)

{
  uchar *puVar1;
  size_t ilen_local;
  uchar *info_local;
  mbedtls_ssl_context *ssl_local;
  
  if (ssl->conf->endpoint == '\x01') {
    free(ssl->cli_id);
    puVar1 = (uchar *)calloc(1,ilen);
    ssl->cli_id = puVar1;
    if (puVar1 == (uchar *)0x0) {
      ssl_local._4_4_ = -0x7f00;
    }
    else {
      memcpy(ssl->cli_id,info,ilen);
      ssl->cli_id_len = ilen;
      ssl_local._4_4_ = 0;
    }
  }
  else {
    ssl_local._4_4_ = -0x7100;
  }
  return ssl_local._4_4_;
}

Assistant:

int mbedtls_ssl_set_client_transport_id(mbedtls_ssl_context *ssl,
                                        const unsigned char *info,
                                        size_t ilen)
{
    if (ssl->conf->endpoint != MBEDTLS_SSL_IS_SERVER) {
        return MBEDTLS_ERR_SSL_BAD_INPUT_DATA;
    }

    mbedtls_free(ssl->cli_id);

    if ((ssl->cli_id = mbedtls_calloc(1, ilen)) == NULL) {
        return MBEDTLS_ERR_SSL_ALLOC_FAILED;
    }

    memcpy(ssl->cli_id, info, ilen);
    ssl->cli_id_len = ilen;

    return 0;
}